

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

bool __thiscall
gtl::
dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
::maybe_shrink(dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
               *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong new_num_buckets;
  bool bVar4;
  
  uVar2 = this->num_elements - this->num_deleted;
  if (this->num_elements < this->num_deleted) {
    __assert_fail("num_elements >= num_deleted",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x255,
                  "bool gtl::dense_hashtable<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, std::equal_to<s2shapeutil::ShapeEdgeId>, std::allocator<s2shapeutil::ShapeEdgeId>>::maybe_shrink() [Value = s2shapeutil::ShapeEdgeId, Key = s2shapeutil::ShapeEdgeId, HashFcn = s2shapeutil::ShapeEdgeIdHash, ExtractKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, SetKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, EqualKey = std::equal_to<s2shapeutil::ShapeEdgeId>, Alloc = std::allocator<s2shapeutil::ShapeEdgeId>]"
                 );
  }
  uVar1 = this->num_buckets;
  if ((uVar1 & uVar1 - 1) != 0) {
    __assert_fail("(bucket_count() & (bucket_count()-1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x256,
                  "bool gtl::dense_hashtable<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, std::equal_to<s2shapeutil::ShapeEdgeId>, std::allocator<s2shapeutil::ShapeEdgeId>>::maybe_shrink() [Value = s2shapeutil::ShapeEdgeId, Key = s2shapeutil::ShapeEdgeId, HashFcn = s2shapeutil::ShapeEdgeIdHash, ExtractKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, SetKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, EqualKey = std::equal_to<s2shapeutil::ShapeEdgeId>, Alloc = std::allocator<s2shapeutil::ShapeEdgeId>]"
                 );
  }
  if (uVar1 < 4) {
    __assert_fail("bucket_count() >= HT_MIN_BUCKETS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,599,
                  "bool gtl::dense_hashtable<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, std::equal_to<s2shapeutil::ShapeEdgeId>, std::allocator<s2shapeutil::ShapeEdgeId>>::maybe_shrink() [Value = s2shapeutil::ShapeEdgeId, Key = s2shapeutil::ShapeEdgeId, HashFcn = s2shapeutil::ShapeEdgeIdHash, ExtractKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, SetKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, EqualKey = std::equal_to<s2shapeutil::ShapeEdgeId>, Alloc = std::allocator<s2shapeutil::ShapeEdgeId>]"
                 );
  }
  bVar4 = uVar2 < (this->settings).
                  super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
                  .shrink_threshold_;
  if (0x20 < uVar1 && bVar4) {
    uVar3 = uVar1;
    do {
      new_num_buckets = uVar3 >> 1;
      if (uVar3 < 0x42) break;
      uVar3 = new_num_buckets;
    } while ((float)uVar2 <
             (float)new_num_buckets *
             (this->settings).
             super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
             .shrink_factor_);
    rebucket(this,new_num_buckets);
  }
  (this->settings).
  super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
  .consider_shrink_ = false;
  return 0x20 < uVar1 && bVar4;
}

Assistant:

bool maybe_shrink() {
    assert(num_elements >= num_deleted);
    assert((bucket_count() & (bucket_count()-1)) == 0);  // is a power of two
    assert(bucket_count() >= HT_MIN_BUCKETS);
    bool retval = false;

    // If you construct a hashtable with < HT_DEFAULT_STARTING_BUCKETS,
    // we'll never shrink until you get relatively big, and we'll never
    // shrink below HT_DEFAULT_STARTING_BUCKETS.  Otherwise, something
    // like "dense_hash_set<int> x; x.insert(4); x.erase(4);" will
    // shrink us down to HT_MIN_BUCKETS buckets, which is too small.
    const size_type num_remain = num_elements - num_deleted;
    const size_type shrink_threshold = settings.shrink_threshold();
    if (shrink_threshold > 0 && num_remain < shrink_threshold &&
        bucket_count() > HT_DEFAULT_STARTING_BUCKETS) {
      const float shrink_factor = settings.shrink_factor();
      size_type sz = bucket_count() / 2;    // find how much we should shrink
      while (sz > HT_DEFAULT_STARTING_BUCKETS &&
             num_remain < sz * shrink_factor) {
        sz /= 2;                            // stay a power of 2
      }
      rebucket(sz);
      retval = true;
    }
    settings.set_consider_shrink(false);    // because we just considered it
    return retval;
  }